

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggx.cpp
# Opt level: O3

float __thiscall
ggx::evaluate(ggx *this,vec3 *light_dir,vec3 *view_dir,float *probability_density_function)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar2 = 0.0;
  if ((view_dir->field_0).field_0.z <= 0.0) {
    *probability_density_function = 0.0;
  }
  else {
    fVar1 = calculate_shadow_masking_term(this,light_dir,view_dir);
    fVar2 = (view_dir->field_0).field_0.z;
    fVar4 = (light_dir->field_0).field_0.z + fVar2;
    fVar5 = (float)*(undefined8 *)&view_dir->field_0;
    fVar8 = (float)*(undefined8 *)&light_dir->field_0 + fVar5;
    fVar6 = (float)((ulong)*(undefined8 *)&view_dir->field_0 >> 0x20);
    fVar10 = (float)((ulong)*(undefined8 *)&light_dir->field_0 >> 0x20) + fVar6;
    fVar7 = 1.0 / SQRT(fVar10 * fVar10 + fVar8 * fVar8 + fVar4 * fVar4);
    fVar4 = fVar4 * fVar7;
    fVar3 = this->_alpha;
    fVar9 = (fVar7 * fVar8) / fVar4;
    fVar11 = (fVar7 * fVar10) / fVar4;
    fVar9 = 1.0 / (((fVar9 * fVar9 + fVar11 * fVar11) / fVar3) / fVar3 + 1.0);
    fVar3 = (fVar9 * fVar9) / (fVar3 * 3.14159 * fVar3 * fVar4 * fVar4 * fVar4 * fVar4);
    *probability_density_function =
         ABS((fVar4 * fVar3 * 0.25) /
             (fVar7 * fVar10 * fVar6 + fVar7 * fVar8 * fVar5 + fVar2 * fVar4));
    fVar2 = (fVar3 * fVar1 * 0.25) / (view_dir->field_0).field_0.z;
  }
  return fVar2;
}

Assistant:

float ggx::evaluate(
  const glm::vec3 &light_dir,
  const glm::vec3 &view_dir,
  float &probability_density_function
) const
{
  if (view_dir.z <= 0)
  {
    probability_density_function = 0;
    return 0;
  }

  float g2 = calculate_shadow_masking_term(light_dir, view_dir);

  const glm::vec3 h = glm::normalize(view_dir + light_dir);
  float ndf = calculateNDF(h);

  // Additional factor in the pdf (1/(4 dot(v,h))) is explained here:
  // - Microfacet Models for Refraction through Rough Surfaces
  // - Notes on the Ward BRDF, Bruce Walter
  probability_density_function = fabsf(ndf * h.z / 4.0f / glm::dot(view_dir, h));

  // We assume that Fresnel factor is equal to 1.
  float res = ndf * g2 / 4.0f / view_dir.z;

  return res;
}